

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusPerpIntercept.cpp
# Opt level: O0

int GeoCalcs::LocusPerpIntercept
              (Locus *loc,LLPoint *pt2,double *crsFromPt,double *distFromPt,LLPoint *intPt,
              double dTol)

{
  bool bVar1;
  double dCrs13;
  uint uVar2;
  double dVar3;
  double __x;
  double dVar4;
  LLPoint LVar5;
  int local_ec;
  double dStack_e8;
  int k;
  double newDist;
  double dStack_d8;
  int maxCount;
  double errarray [2];
  double distarray [2];
  double locAngle;
  LLPoint geoPt;
  LLPoint locPt;
  double local_80;
  undefined1 local_78 [8];
  LLPoint geoPt_1;
  double gdist;
  double gcrs;
  InverseResult result;
  double dTol_local;
  LLPoint *intPt_local;
  double *distFromPt_local;
  double *crsFromPt_local;
  LLPoint *pt2_local;
  Locus *loc_local;
  
  result.distance = dTol;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&gcrs);
  DistVincenty(&loc->geoStart,&loc->geoEnd,(InverseResult *)&gcrs);
  dCrs13 = gcrs;
  geoPt_1.longitude = result.reverseAzimuth;
  if (result.distance <= ABS(loc->startDist - loc->endDist)) {
    DistVincenty(&loc->locusStart,&loc->locusEnd,(InverseResult *)&gcrs);
    join_0x00001240_0x00001200_ =
         PerpIntercept(&loc->locusStart,gcrs,pt2,crsFromPt,distFromPt,result.distance);
    _locAngle = PerpIntercept(&loc->geoStart,dCrs13,(LLPoint *)&geoPt.longitude,crsFromPt,distFromPt
                              ,result.distance);
    __x = atan((loc->startDist - loc->endDist) / geoPt_1.longitude);
    errarray[0] = 0.0;
    dStack_d8 = 0.0;
    errarray[1] = 0.0;
    DistVincenty(&loc->geoStart,(LLPoint *)&locAngle,(InverseResult *)&gcrs);
    distarray[0] = result.reverseAzimuth;
    newDist._4_4_ = 0xf;
    dStack_e8 = 0.0;
    local_ec = 0;
    while( true ) {
      bVar1 = true;
      if (local_ec != 0) {
        uVar2 = std::isnan(dStack_e8);
        bVar1 = false;
        if (((uVar2 & 1) == 0) && (bVar1 = false, result.distance < ABS(errarray[0]))) {
          bVar1 = local_ec < 0xf;
        }
      }
      if (!bVar1) goto LAB_001b7d03;
      _locAngle = DestVincenty(&loc->geoStart,dCrs13,distarray[0]);
      join_0x00001240_0x00001200_ = PointOnLocusP(loc,(LLPoint *)&locAngle,result.distance,5e-16);
      DistVincenty((LLPoint *)&geoPt.longitude,pt2,(InverseResult *)&gcrs);
      dVar3 = -result.reverseAzimuth;
      dVar4 = LocusCrsAtPoint(loc,(LLPoint *)&geoPt.longitude,(LLPoint *)&locAngle,1e-08);
      dVar4 = SignAzimuthDifference(dVar4,gcrs);
      dVar4 = cos(ABS(dVar4));
      dVar3 = dVar3 * dVar4;
      errarray[0] = dVar3;
      if (ABS(dVar3) < result.distance) break;
      if (local_ec == 0) {
        dVar4 = cos(__x);
        dStack_e8 = dVar3 * dVar4 + distarray[0];
      }
      else {
        FindLinearRoot(errarray + 1,&stack0xffffffffffffff28,&stack0xffffffffffffff18);
      }
      errarray[1] = distarray[0];
      distarray[0] = dStack_e8;
      dStack_d8 = errarray[0];
      local_ec = local_ec + 1;
    }
    *distFromPt = result.reverseAzimuth;
    *crsFromPt = result.azimuth;
    intPt->latitude = geoPt.longitude;
    intPt->longitude = locPt.latitude;
LAB_001b7d03:
    intPt->latitude = geoPt.longitude;
    intPt->longitude = locPt.latitude;
    DistVincenty(pt2,intPt,(InverseResult *)&gcrs);
    *distFromPt = result.reverseAzimuth;
    *crsFromPt = gcrs;
  }
  else {
    _local_78 = PerpIntercept(&loc->geoStart,gcrs,pt2,crsFromPt,distFromPt,result.distance);
    LVar5 = PointOnLocusP(loc,(LLPoint *)local_78,result.distance,5e-16);
    locPt.longitude = LVar5.latitude;
    intPt->latitude = locPt.longitude;
    local_80 = LVar5.longitude;
    intPt->longitude = local_80;
    DistVincenty(pt2,intPt,(InverseResult *)&gcrs);
    *distFromPt = result.reverseAzimuth;
    *crsFromPt = gcrs;
  }
  return 1;
}

Assistant:

int LocusPerpIntercept(const Locus &loc, const LLPoint &pt2, double &crsFromPt,
                           double &distFromPt, LLPoint &intPt, double dTol)
    {
        InverseResult result;
        DistVincenty(loc.geoStart, loc.geoEnd, result);
        double gcrs = result.azimuth;
        double gdist = result.distance;

        if (fabs(loc.startDist - loc.endDist) < dTol)
        {
            const LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, pt2, crsFromPt, distFromPt, dTol);
            intPt = PointOnLocusP(loc, geoPt, dTol, kEps);
            DistVincenty(pt2, intPt, result);
            distFromPt = result.distance;
            crsFromPt = result.azimuth;
            return 1;
        }

        DistVincenty(loc.locusStart, loc.locusEnd, result);
        LLPoint locPt = PerpIntercept(loc.locusStart, result.azimuth, pt2, crsFromPt, distFromPt, dTol);
        LLPoint geoPt = PerpIntercept(loc.geoStart, gcrs, locPt, crsFromPt, distFromPt, dTol);
        const double locAngle = atan((loc.startDist - loc.endDist) / gdist);

        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;

        DistVincenty(loc.geoStart, geoPt, result);
        distarray[1] = result.distance;

        const int maxCount = 15;
        double newDist = 0.0;
        int k = 0;
        while (k == 0 || (!std::isnan(newDist) && fabs(errarray[1]) > dTol && k < maxCount))
        {
            geoPt = DestVincenty(loc.geoStart, gcrs, distarray[1]);
            locPt = PointOnLocusP(loc /*loc.geoStart*/, geoPt, dTol, kEps);

            DistVincenty(locPt, pt2, result);
            errarray[1] = -result.distance * cos(fabs(
                    SignAzimuthDifference(LocusCrsAtPoint(loc, locPt, geoPt, 1e-8), result.azimuth)));

            if (fabs(errarray[1]) < dTol)
            {
                distFromPt = result.distance;
                crsFromPt = result.reverseAzimuth;
                intPt = locPt;
                break;
            }

            if (k == 0)
                newDist = distarray[1] + errarray[1] * cos(locAngle);
            else
                FindLinearRoot(distarray, errarray, newDist);
            distarray[0] = distarray[1];
            distarray[1] = newDist;
            errarray[0] = errarray[1];
            k++;
        }

        intPt = locPt;
        DistVincenty(pt2, intPt, result);
        distFromPt = result.distance;
        crsFromPt = result.azimuth;
        return 1;
    }